

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O3

char * __thiscall
glcts::TextureCubeMapArrayTextureSizeTFGeometryShader::getVertexShaderCode
          (TextureCubeMapArrayTextureSizeTFGeometryShader *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nvoid main()\n{\n    gl_Position      = vec4(0.0f,0.0f,0.0f,0.0f);\n}\n"
  ;
}

Assistant:

const char* TextureCubeMapArrayTextureSizeTFGeometryShader::getVertexShaderCode(void)
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position      = vec4(0.0f,0.0f,0.0f,0.0f);\n"
								"}\n";
	return result;
}